

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogLocalResolve(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  int local_44;
  int n_sysID;
  xmlChar *sysID;
  int n_pubID;
  xmlChar *pubID;
  int n_catalogs;
  void *catalogs;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (pubID._4_4_ = 0; (int)pubID._4_4_ < 2; pubID._4_4_ = pubID._4_4_ + 1) {
    for (sysID._4_4_ = 0; (int)sysID._4_4_ < 5; sysID._4_4_ = sysID._4_4_ + 1) {
      for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_void_ptr(pubID._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(sysID._4_4_,1);
        val_01 = gen_const_xmlChar_ptr(local_44,2);
        val_02 = (xmlChar *)xmlCatalogLocalResolve(val,val_00,val_01);
        desret_xmlChar_ptr(val_02);
        call_tests = call_tests + 1;
        des_void_ptr(pubID._4_4_,val,0);
        des_const_xmlChar_ptr(sysID._4_4_,val_00,1);
        des_const_xmlChar_ptr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCatalogLocalResolve",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)pubID._4_4_);
          printf(" %d",(ulong)sysID._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlCatalogLocalResolve(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    int mem_base;
    xmlChar * ret_val;
    void * catalogs; /* a document's list of catalogs */
    int n_catalogs;
    const xmlChar * pubID; /* the public ID string */
    int n_pubID;
    const xmlChar * sysID; /* the system ID string */
    int n_sysID;

    for (n_catalogs = 0;n_catalogs < gen_nb_void_ptr;n_catalogs++) {
    for (n_pubID = 0;n_pubID < gen_nb_const_xmlChar_ptr;n_pubID++) {
    for (n_sysID = 0;n_sysID < gen_nb_const_xmlChar_ptr;n_sysID++) {
        mem_base = xmlMemBlocks();
        catalogs = gen_void_ptr(n_catalogs, 0);
        pubID = gen_const_xmlChar_ptr(n_pubID, 1);
        sysID = gen_const_xmlChar_ptr(n_sysID, 2);

        ret_val = xmlCatalogLocalResolve(catalogs, pubID, sysID);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_void_ptr(n_catalogs, catalogs, 0);
        des_const_xmlChar_ptr(n_pubID, pubID, 1);
        des_const_xmlChar_ptr(n_sysID, sysID, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCatalogLocalResolve",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_catalogs);
            printf(" %d", n_pubID);
            printf(" %d", n_sysID);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}